

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_cluster_on_connect(intptr_t uuid,void *udata)

{
  channel_s *pcVar1;
  fio_match_fn p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [24];
  undefined1 auVar8 [24];
  undefined1 auVar9 [24];
  undefined1 auVar10 [24];
  fio_lock_i fVar11;
  fio_msg_internal_s *pfVar12;
  fio_protocol_s *protocol_;
  uint32_t uVar13;
  fio_ch_set__ordered_s_ *pfVar14;
  fio_str_info_s ch_name;
  fio_str_info_s msg;
  timespec local_58;
  char *local_48;
  ulong local_40 [3];
  ulong *local_28;
  
  LOCK();
  UNLOCK();
  local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fio_postoffice.pubsub.lock);
  cluster_data.uuid = uuid;
  if (fio_postoffice.pubsub.lock != '\0') {
    do {
      fio_postoffice.pubsub.lock = '\x01';
      local_58.tv_sec = 0;
      local_58.tv_nsec = 1;
      nanosleep(&local_58,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fio_postoffice.pubsub.lock);
    } while (fio_postoffice.pubsub.lock != '\0');
  }
  fio_postoffice.pubsub.lock = '\x01';
  if ((fio_postoffice.pubsub.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
     (fio_postoffice.pubsub.channels.ordered <
      fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos)) {
    pfVar14 = fio_postoffice.pubsub.channels.ordered;
    do {
      if ((((pfVar14->hash != 0) && (fio_data->is_worker != '\0')) &&
          (pcVar1 = pfVar14->obj, pcVar1 != (channel_s *)0x0)) &&
         ((fio_data->workers != 1 && (cluster_data.uuid != 0)))) {
        local_58.tv_sec = 0;
        local_58.tv_nsec = pcVar1->name_len;
        local_48 = pcVar1->name;
        uVar3 = pcVar1->name_len;
        uVar4 = pcVar1->name;
        auVar7._8_8_ = uVar4;
        auVar7._0_8_ = uVar3;
        local_28 = (ulong *)0x0;
        local_40[1] = 0;
        local_40[2] = 0;
        local_40[0] = 0;
        p_Var2 = pcVar1->match;
        if (p_Var2 == (fio_match_fn)0x0) {
          uVar13 = 4;
        }
        else {
          local_40[0] = (ulong)p_Var2 >> 0x38 | ((ulong)p_Var2 & 0xff000000000000) >> 0x28 |
                        ((ulong)p_Var2 & 0xff0000000000) >> 0x18 |
                        ((ulong)p_Var2 & 0xff00000000) >> 8 | ((ulong)p_Var2 & 0xff000000) << 8 |
                        ((ulong)p_Var2 & 0xff0000) << 0x18 | ((ulong)p_Var2 & 0xff00) << 0x28 |
                        (long)p_Var2 << 0x38;
          local_40[2] = 8;
          uVar13 = 6;
          local_28 = local_40;
        }
        auVar7._16_8_ = 0;
        auVar8._8_8_ = local_28;
        auVar8._0_8_ = local_40[2];
        auVar8._16_8_ = 0;
        pfVar12 = fio_msg_internal_create
                            (0,uVar13,(fio_str_info_s)(auVar7 << 0x40),
                             (fio_str_info_s)(auVar8 << 0x40),'\0','\x01');
        fio_cluster_client_sender(pfVar12,-1);
      }
      pfVar14 = pfVar14 + 1;
    } while (pfVar14 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos);
  }
  LOCK();
  fio_postoffice.pubsub.lock = '\0';
  UNLOCK();
  LOCK();
  UNLOCK();
  local_58.tv_sec = CONCAT71((int7)((ulong)local_58.tv_sec >> 8),fio_postoffice.patterns.lock);
  if (fio_postoffice.patterns.lock != '\0') {
    do {
      fio_postoffice.patterns.lock = '\x01';
      local_58.tv_sec = 0;
      local_58.tv_nsec = 1;
      nanosleep(&local_58,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fio_postoffice.patterns.lock);
    } while (fio_postoffice.patterns.lock != '\0');
  }
  fio_postoffice.patterns.lock = '\x01';
  if ((fio_postoffice.patterns.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
     (fio_postoffice.patterns.channels.ordered <
      fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos)) {
    pfVar14 = fio_postoffice.patterns.channels.ordered;
    do {
      if ((((pfVar14->hash != 0) && (fio_data->is_worker != '\0')) &&
          (pcVar1 = pfVar14->obj, pcVar1 != (channel_s *)0x0)) &&
         ((fio_data->workers != 1 && (cluster_data.uuid != 0)))) {
        local_58.tv_sec = 0;
        local_58.tv_nsec = pcVar1->name_len;
        local_48 = pcVar1->name;
        uVar5 = pcVar1->name_len;
        uVar6 = pcVar1->name;
        auVar9._8_8_ = uVar6;
        auVar9._0_8_ = uVar5;
        local_28 = (ulong *)0x0;
        local_40[1] = 0;
        local_40[2] = 0;
        local_40[0] = 0;
        p_Var2 = pcVar1->match;
        if (p_Var2 == (fio_match_fn)0x0) {
          uVar13 = 4;
        }
        else {
          local_40[0] = (ulong)p_Var2 >> 0x38 | ((ulong)p_Var2 & 0xff000000000000) >> 0x28 |
                        ((ulong)p_Var2 & 0xff0000000000) >> 0x18 |
                        ((ulong)p_Var2 & 0xff00000000) >> 8 | ((ulong)p_Var2 & 0xff000000) << 8 |
                        ((ulong)p_Var2 & 0xff0000) << 0x18 | ((ulong)p_Var2 & 0xff00) << 0x28 |
                        (long)p_Var2 << 0x38;
          local_40[2] = 8;
          uVar13 = 6;
          local_28 = local_40;
        }
        auVar9._16_8_ = 0;
        auVar10._8_8_ = local_28;
        auVar10._0_8_ = local_40[2];
        auVar10._16_8_ = 0;
        pfVar12 = fio_msg_internal_create
                            (0,uVar13,(fio_str_info_s)(auVar9 << 0x40),
                             (fio_str_info_s)(auVar10 << 0x40),'\0','\x01');
        fio_cluster_client_sender(pfVar12,-1);
      }
      pfVar14 = pfVar14 + 1;
    } while (pfVar14 < fio_postoffice.patterns.channels.ordered +
                       fio_postoffice.patterns.channels.pos);
  }
  fVar11 = fio_postoffice.patterns.lock;
  LOCK();
  fio_postoffice.patterns.lock = '\0';
  UNLOCK();
  local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fVar11);
  protocol_ = fio_cluster_protocol_alloc(uuid,fio_cluster_client_handler,fio_cluster_client_sender);
  fio_attach__internal((void *)uuid,protocol_);
  return;
}

Assistant:

static void fio_cluster_on_connect(intptr_t uuid, void *udata) {
  cluster_data.uuid = uuid;

  /* inform root about all existing channels */
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.patterns.lock);

  fio_attach(uuid, fio_cluster_protocol_alloc(uuid, fio_cluster_client_handler,
                                              fio_cluster_client_sender));
  (void)udata;
}